

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall google::protobuf::MethodOptions::MergeFrom(MethodOptions *this,Message *from)

{
  MethodOptions *from_00;
  
  from_00 = (MethodOptions *)__dynamic_cast(from,&Message::typeinfo,&typeinfo,0);
  if (from_00 != (MethodOptions *)0x0) {
    MergeFrom(this,from_00);
    return;
  }
  internal::ReflectionOps::Merge(from,&this->super_Message);
  return;
}

Assistant:

void MethodOptions::MergeFrom(const ::PROTOBUF_NAMESPACE_ID::Message& from) {
// @@protoc_insertion_point(generalized_merge_from_start:google.protobuf.MethodOptions)
  GOOGLE_DCHECK_NE(&from, this);
  const MethodOptions* source =
      ::PROTOBUF_NAMESPACE_ID::DynamicCastToGenerated<MethodOptions>(
          &from);
  if (source == nullptr) {
  // @@protoc_insertion_point(generalized_merge_from_cast_fail:google.protobuf.MethodOptions)
    ::PROTOBUF_NAMESPACE_ID::internal::ReflectionOps::Merge(from, this);
  } else {
  // @@protoc_insertion_point(generalized_merge_from_cast_success:google.protobuf.MethodOptions)
    MergeFrom(*source);
  }
}